

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

uint Ssw_RarManObjHashWord(void *pMan,Aig_Obj_t *pObj)

{
  word *pwVar1;
  uint local_30;
  uint local_2c;
  int i;
  uint uHash;
  uint *pSims;
  Ssw_RarMan_t *p;
  Aig_Obj_t *pObj_local;
  void *pMan_local;
  
  local_2c = 0;
  pwVar1 = Ssw_RarObjSim((Ssw_RarMan_t *)pMan,pObj->Id);
  for (local_30 = 0;
      SBORROW4(local_30,*(int *)(*pMan + 4) * 2) != (int)(local_30 + *(int *)(*pMan + 4) * -2) < 0;
      local_30 = local_30 + 1) {
    local_2c = *(int *)((long)pwVar1 + (long)(int)local_30 * 4) *
               Ssw_RarManObjHashWord::s_SPrimes[(int)(local_30 & 0x7f)] ^ local_2c;
  }
  return local_2c;
}

Assistant:

unsigned Ssw_RarManObjHashWord( void * pMan, Aig_Obj_t * pObj )
{
    Ssw_RarMan_t * p = (Ssw_RarMan_t *)pMan;
    static int s_SPrimes[128] = {
        1009, 1049, 1093, 1151, 1201, 1249, 1297, 1361, 1427, 1459,
        1499, 1559, 1607, 1657, 1709, 1759, 1823, 1877, 1933, 1997,
        2039, 2089, 2141, 2213, 2269, 2311, 2371, 2411, 2467, 2543,
        2609, 2663, 2699, 2741, 2797, 2851, 2909, 2969, 3037, 3089,
        3169, 3221, 3299, 3331, 3389, 3461, 3517, 3557, 3613, 3671,
        3719, 3779, 3847, 3907, 3943, 4013, 4073, 4129, 4201, 4243,
        4289, 4363, 4441, 4493, 4549, 4621, 4663, 4729, 4793, 4871,
        4933, 4973, 5021, 5087, 5153, 5227, 5281, 5351, 5417, 5471,
        5519, 5573, 5651, 5693, 5749, 5821, 5861, 5923, 6011, 6073,
        6131, 6199, 6257, 6301, 6353, 6397, 6481, 6563, 6619, 6689,
        6737, 6803, 6863, 6917, 6977, 7027, 7109, 7187, 7237, 7309,
        7393, 7477, 7523, 7561, 7607, 7681, 7727, 7817, 7877, 7933,
        8011, 8039, 8059, 8081, 8093, 8111, 8123, 8147
    };
    unsigned * pSims;
    unsigned uHash;
    int i;
    uHash = 0;
    pSims = (unsigned *)Ssw_RarObjSim( p, pObj->Id );
    for ( i = 0; i < 2 * p->pPars->nWords; i++ )
        uHash ^= pSims[i] * s_SPrimes[i & 0x7F];
    return uHash;
}